

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O0

boxptr find_biggest_color_pop(boxptr boxlist,int numboxes)

{
  boxptr which;
  long maxc;
  int i;
  boxptr boxp;
  int numboxes_local;
  boxptr boxlist_local;
  
  maxc = 0;
  which = (boxptr)0x0;
  boxp = boxlist;
  for (i = 0; i < numboxes; i = i + 1) {
    if ((maxc < boxp->colorcount) && (0 < boxp->volume)) {
      which = boxp;
      maxc = boxp->colorcount;
    }
    boxp = boxp + 1;
  }
  return which;
}

Assistant:

LOCAL(boxptr)
find_biggest_color_pop(boxptr boxlist, int numboxes)
/* Find the splittable box with the largest color population */
/* Returns NULL if no splittable boxes remain */
{
  register boxptr boxp;
  register int i;
  register long maxc = 0;
  boxptr which = NULL;

  for (i = 0, boxp = boxlist; i < numboxes; i++, boxp++) {
    if (boxp->colorcount > maxc && boxp->volume > 0) {
      which = boxp;
      maxc = boxp->colorcount;
    }
  }
  return which;
}